

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O3

QString * __thiscall
Mustache::Renderer::render
          (QString *__return_storage_ptr__,Renderer *this,QString *_template,int startPos,int endPos
          ,Context *context)

{
  qsizetype qVar1;
  PartialResolver *pPVar2;
  Data *pDVar3;
  QArrayData *pQVar4;
  QString *pQVar5;
  CutResult CVar6;
  int iVar7;
  uint uVar8;
  QString *pQVar9;
  pointer pQVar10;
  QArrayData *pQVar11;
  int i;
  uint uVar12;
  ulong uVar13;
  char16_t *pcVar14;
  long lVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QString tagStartMarker;
  QString tagEndMarker;
  Tag endTag;
  Tag tag;
  QString partialContent;
  QString local_178;
  QString *local_158;
  int local_14c;
  QString local_148;
  QArrayData *local_128;
  QArrayData *pQStack_120;
  char16_t *local_118;
  QArrayData *local_108;
  QArrayData *pQStack_100;
  char16_t *local_f8;
  int local_e8;
  int local_e4;
  QString *local_d8;
  Tag local_d0;
  Renderer *local_a0;
  QArrayData *local_98;
  QArrayData *pQStack_90;
  char16_t *local_88;
  QString local_78;
  Type local_54;
  QString *local_50;
  QString *local_48;
  QString *local_40;
  QString *local_38;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48 = &this->m_tagStartMarker;
  local_50 = &this->m_tagEndMarker;
  local_38 = &this->m_defaultTagStartMarker;
  local_40 = &this->m_defaultTagEndMarker;
  local_158 = __return_storage_ptr__;
  local_14c = endPos;
  local_d8 = _template;
  local_a0 = this;
  do {
    pQVar5 = local_d8;
    if (this->m_errorPos != -1) {
      return local_158;
    }
    findTag(&local_d0,this,local_d8,startPos,local_14c);
    pcVar14 = (pQVar5->d).ptr;
    qVar1 = (pQVar5->d).size;
    local_108 = (QArrayData *)(long)startPos;
    local_54 = local_d0.type;
    if (local_d0.type == Null) {
      local_178.d.d = (Data *)(long)(local_14c - startPos);
      CVar6 = QtPrivate::QContainerImplHelper::mid
                        (qVar1,(qsizetype *)&local_108,(qsizetype *)&local_178);
      if (CVar6 == Null) {
        pcVar14 = (char16_t *)0x0;
      }
      else {
        pcVar14 = pcVar14 + (long)local_108;
      }
      QString::append((QChar *)local_158,(longlong)pcVar14);
    }
    else {
      local_178.d.d = (Data *)((long)local_d0.start - (long)local_108);
      CVar6 = QtPrivate::QContainerImplHelper::mid
                        (qVar1,(qsizetype *)&local_108,(qsizetype *)&local_178);
      if (CVar6 == Null) {
        pcVar14 = (char16_t *)0x0;
      }
      else {
        pcVar14 = pcVar14 + (long)local_108;
      }
      QString::append((QChar *)local_158,(longlong)pcVar14);
      switch(local_d0.type) {
      case Value:
        (*context->_vptr_Context[2])((Tag *)&local_108,context,&local_d0.key);
        if (local_d0.escapeMode == Unescape) {
          unescapeHtml(&local_178,(QString *)&local_108);
LAB_00117121:
          pQVar4 = pQStack_100;
          pQVar11 = local_108;
          qVar1 = local_178.d.size;
          pDVar3 = local_178.d.d;
          local_178.d.d = (Data *)local_108;
          local_108 = &pDVar3->super_QArrayData;
          pQStack_100 = (QArrayData *)local_178.d.ptr;
          local_178.d.ptr = (char16_t *)pQVar4;
          local_178.d.size = (qsizetype)local_f8;
          local_f8 = (char16_t *)qVar1;
          if (pQVar11 != (QArrayData *)0x0) {
            LOCK();
            (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar11,2,8);
            }
          }
        }
        else if (local_d0.escapeMode == Escape) {
          escapeHtml(&local_178,(QString *)&local_108);
          goto LAB_00117121;
        }
        QString::append((QString *)local_158);
        startPos = local_d0.end;
        if (local_108 != (QArrayData *)0x0) {
          LOCK();
          (local_108->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          iVar7 = (local_108->ref_)._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          pQVar11 = local_108;
joined_r0x00117107:
          if (iVar7 == 0) {
            QArrayData::deallocate(pQVar11,2,8);
          }
        }
        break;
      case SectionStart:
        findEndTag((Tag *)&local_108,this,local_d8,&local_d0,local_14c);
        pQVar5 = local_d8;
        if ((Type)local_108 == Null) {
          if (this->m_errorPos == -1) {
            QVar22.m_data = (storage_type *)0x25;
            QVar22.m_size = (qsizetype)&local_178;
            QString::fromUtf8(QVar22);
            local_148.d.d = local_178.d.d;
            local_148.d.ptr = local_178.d.ptr;
            local_148.d.size = local_178.d.size;
            setError(this,&local_148,local_d0.start);
            if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
              }
            }
          }
        }
        else {
          uVar8 = (*context->_vptr_Context[4])(context,&local_d0.key);
          if ((int)uVar8 < 1) {
            iVar7 = (*context->_vptr_Context[7])(context,&local_d0.key);
            if ((char)iVar7 == '\0') {
              iVar7 = (*context->_vptr_Context[3])(context,&local_d0.key);
              startPos = local_e4;
              if ((char)iVar7 == '\0') {
                (*context->_vptr_Context[5])(context,&local_d0.key,0xffffffff);
                render(&local_178,local_a0,pQVar5,local_d0.end,local_e8,context);
                QString::append((QString *)local_158);
                if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
                  }
                }
                (*context->_vptr_Context[6])(context);
                startPos = local_e4;
              }
            }
            else {
              QString::mid((longlong)&local_148,(longlong)pQVar5);
              (*context->_vptr_Context[8])(&local_178,context,&local_d0.key,&local_148,local_a0);
              QString::append((QString *)local_158);
              if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
                }
              }
              startPos = local_e4;
              if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
                  startPos = local_e4;
                }
              }
            }
          }
          else {
            uVar13 = 0;
            do {
              (*context->_vptr_Context[5])(context,&local_d0.key,uVar13);
              render(&local_178,local_a0,pQVar5,local_d0.end,local_e8,context);
              QString::append((QString *)local_158);
              if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
                }
              }
              (*context->_vptr_Context[6])(context);
              uVar12 = (int)uVar13 + 1;
              uVar13 = (ulong)uVar12;
              startPos = local_e4;
            } while (uVar8 != uVar12);
          }
        }
        this = local_a0;
        if (pQStack_100 != (QArrayData *)0x0) {
          LOCK();
          (pQStack_100->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQStack_100->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQStack_100->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQStack_100,2,8);
            this = local_a0;
          }
        }
        break;
      case InvertedSectionStart:
        findEndTag((Tag *)&local_108,this,local_d8,&local_d0,local_14c);
        if ((Type)local_108 == Null) {
          if (this->m_errorPos == -1) {
            QVar21.m_data = (storage_type *)0x2e;
            QVar21.m_size = (qsizetype)&local_178;
            QString::fromUtf8(QVar21);
            local_148.d.d = local_178.d.d;
            local_148.d.ptr = local_178.d.ptr;
            local_148.d.size = local_178.d.size;
            setError(this,&local_148,local_d0.start);
            if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
              }
            }
          }
        }
        else {
          iVar7 = (*context->_vptr_Context[3])(context,&local_d0.key);
          startPos = local_e4;
          if ((char)iVar7 != '\0') {
            render(&local_178,this,local_d8,local_d0.end,local_e8,context);
            QString::append((QString *)local_158);
            startPos = local_e4;
            if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
                startPos = local_e4;
              }
            }
          }
        }
        if (pQStack_100 != (QArrayData *)0x0) {
          LOCK();
          (pQStack_100->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQStack_100->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          iVar7 = (pQStack_100->ref_)._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          pQVar11 = pQStack_100;
          goto joined_r0x00117107;
        }
        break;
      case SectionEnd:
        QVar16.m_data = (storage_type *)0x12;
        QVar16.m_size = (qsizetype)&local_108;
        QString::fromUtf8(QVar16);
        local_178.d.d = (Data *)local_108;
        local_178.d.ptr = (char16_t *)pQStack_100;
        local_178.d.size = (qsizetype)local_f8;
        setError(this,&local_178,local_d0.start);
        if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
          }
        }
      case Comment:
      case SetDelimiter:
        startPos = local_d0.end;
        break;
      case Partial:
        local_178.d.d = (this->m_tagStartMarker).d.d;
        local_178.d.ptr = (this->m_tagStartMarker).d.ptr;
        local_178.d.size = (this->m_tagStartMarker).d.size;
        if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_148.d.d = (this->m_tagEndMarker).d.d;
        local_148.d.ptr = (this->m_tagEndMarker).d.ptr;
        local_148.d.size = (this->m_tagEndMarker).d.size;
        if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_148.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_148.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::operator=(local_48,(QString *)local_38);
        QString::operator=(local_50,(QString *)local_40);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this,
                   (this->m_partialStack).super_QList<QString>.d.size,&local_d0.key);
        pPVar2 = context->m_partialResolver;
        if (pPVar2 == (PartialResolver *)0x0) {
          local_78.d.d = (Data *)0x0;
          local_78.d.ptr = (char16_t *)0x0;
          local_78.d.size = 0;
        }
        else {
          (*pPVar2->_vptr_PartialResolver[2])(&local_78,pPVar2,&local_d0.key);
        }
        if (0 < local_d0.indentation) {
          QVar17.m_data = (storage_type *)0x1;
          QVar17.m_size = (qsizetype)&local_108;
          QString::fromUtf8(QVar17);
          local_98 = local_108;
          pQStack_90 = pQStack_100;
          local_88 = local_f8;
          QString::repeated((longlong)&local_128);
          QString::append((QString *)local_158);
          if (local_128 != (QArrayData *)0x0) {
            LOCK();
            (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_128,2,8);
            }
          }
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_98,2,8);
            }
          }
          QVar18.m_data = (storage_type *)0x1;
          QVar18.m_size = (qsizetype)&local_108;
          QString::fromUtf8(QVar18);
          local_128 = local_108;
          pQStack_120 = pQStack_100;
          local_118 = local_f8;
          uVar8 = QString::indexOf((QString *)&local_78,(longlong)&local_128,CaseInsensitive);
          while( true ) {
            if (local_128 != (QArrayData *)0x0) {
              LOCK();
              (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_128,2,8);
              }
            }
            if (((int)uVar8 < 1) || (local_78.d.size + -1 <= (long)(ulong)(uVar8 & 0x7fffffff)))
            break;
            QVar19.m_data = (storage_type *)0x1;
            QVar19.m_size = (qsizetype)&local_108;
            QString::fromUtf8(QVar19);
            local_98 = local_108;
            pQStack_90 = pQStack_100;
            local_88 = local_f8;
            QString::repeated((longlong)&local_128);
            pQVar11 = pQStack_120;
            if (pQStack_120 == (QArrayData *)0x0) {
              pQVar11 = (QArrayData *)&QString::_empty;
            }
            pQVar9 = (QString *)
                     QString::insert((longlong)&local_78,(QChar *)(ulong)(uVar8 + CaseSensitive),
                                     (longlong)pQVar11);
            QString::operator=(&local_78,pQVar9);
            if (local_128 != (QArrayData *)0x0) {
              LOCK();
              (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_128,2,8);
              }
            }
            if (local_98 != (QArrayData *)0x0) {
              LOCK();
              (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_98,2,8);
              }
            }
            QVar20.m_data = (storage_type *)0x1;
            QVar20.m_size = (qsizetype)&local_108;
            QString::fromUtf8(QVar20);
            local_128 = local_108;
            pQStack_120 = pQStack_100;
            local_118 = local_f8;
            uVar8 = QString::indexOf((QString *)&local_78,(longlong)&local_128,uVar8 + CaseSensitive
                                    );
          }
        }
        render((QString *)&local_108,this,&local_78,0,(int)local_78.d.size,context);
        QString::append((QString *)local_158);
        startPos = local_d0.end;
        pQVar10 = QList<QString>::data((QList<QString> *)this);
        lVar15 = (this->m_partialStack).super_QList<QString>.d.size;
        pQVar11 = &(pQVar10[lVar15 + -1].d.d)->super_QArrayData;
        if (pQVar11 != (QArrayData *)0x0) {
          LOCK();
          (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          lVar15 = (this->m_partialStack).super_QList<QString>.d.size;
        }
        QList<QString>::resize((QList<QString> *)this,lVar15 + -1);
        if (pQVar11 != (QArrayData *)0x0) {
          LOCK();
          (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar11,2,8);
          }
        }
        QString::operator=(local_48,(QString *)&local_178);
        QString::operator=(local_50,(QString *)&local_148);
        if (local_108 != (QArrayData *)0x0) {
          LOCK();
          (local_108->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_108,2,8);
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
          }
        }
        if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
          }
        }
        if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          iVar7 = ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          pQVar11 = &(local_178.d.d)->super_QArrayData;
          goto joined_r0x00117107;
        }
      }
    }
    if (&(local_d0.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d0.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d0.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d0.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d0.key.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_54 == Null) {
      return local_158;
    }
  } while( true );
}

Assistant:

QString Renderer::render(const QString& _template, int startPos, int endPos, Context* context)
{
	QString output;
	int lastTagEnd = startPos;

	while (m_errorPos == -1) {
		Tag tag = findTag(_template, lastTagEnd, endPos);
		if (tag.type == Tag::Null) {
			output += QStringView(_template).mid(lastTagEnd, endPos - lastTagEnd);
			break;
		}
		output += QStringView(_template).mid(lastTagEnd, tag.start - lastTagEnd);
		switch (tag.type) {
		case Tag::Value:
		{
			QString value = context->stringValue(tag.key);
			if (tag.escapeMode == Tag::Escape) {
				value = escapeHtml(value);
			} else if (tag.escapeMode == Tag::Unescape) {
				value = unescapeHtml(value);
			}
			output += value;
			lastTagEnd = tag.end;
		}
		break;
		case Tag::SectionStart:
		{
			Tag endTag = findEndTag(_template, tag, endPos);
			if (endTag.type == Tag::Null) {
				if (m_errorPos == -1) {
					setError("No matching end tag found for section", tag.start);
				}
			} else {
				int listCount = context->listCount(tag.key);
				if (listCount > 0) {
					for (int i=0; i < listCount; i++) {
						context->push(tag.key, i);
						output += render(_template, tag.end, endTag.start, context);
						context->pop();
					}
				} else if (context->canEval(tag.key)) {
					output += context->eval(tag.key, _template.mid(tag.end, endTag.start - tag.end), this);
				} else if (!context->isFalse(tag.key)) {
					context->push(tag.key);
					output += render(_template, tag.end, endTag.start, context);
					context->pop();
				}
				lastTagEnd = endTag.end;
			}
		}
		break;
		case Tag::InvertedSectionStart:
		{
			Tag endTag = findEndTag(_template, tag, endPos);
			if (endTag.type == Tag::Null) {
				if (m_errorPos == -1) {
					setError("No matching end tag found for inverted section", tag.start);
				}
			} else {
				if (context->isFalse(tag.key)) {
					output += render(_template, tag.end, endTag.start, context);
				}
				lastTagEnd = endTag.end;
			}
		}
		break;
		case Tag::SectionEnd:
			setError("Unexpected end tag", tag.start);
			lastTagEnd = tag.end;
			break;
		case Tag::Partial:
		{
			QString tagStartMarker = m_tagStartMarker;
			QString tagEndMarker = m_tagEndMarker;

			m_tagStartMarker = m_defaultTagStartMarker;
			m_tagEndMarker = m_defaultTagEndMarker;

			m_partialStack.push(tag.key);

			QString partialContent = context->partialValue(tag.key);

			// If there is a need to add a special indentation to the partial
			if (tag.indentation > 0) {
				output += QString(" ").repeated(tag.indentation);
				// Indenting the output to keep the parent indentation.
				int posOfLF = partialContent.indexOf("\n", 0);
				while (posOfLF > 0 && posOfLF < (partialContent.length() - 1)) { // .length() - 1 because we dont want indentation AFTER the last character if it's a LF
					partialContent = partialContent.insert(posOfLF + 1, QString(" ").repeated(tag.indentation));
					posOfLF = partialContent.indexOf("\n", posOfLF + 1);
				}
			}

			QString partialRendered = render(partialContent, 0, partialContent.length(), context);

			output += partialRendered;

			lastTagEnd = tag.end;

			m_partialStack.pop();

			m_tagStartMarker = tagStartMarker;
			m_tagEndMarker = tagEndMarker;
		}
		break;
		case Tag::SetDelimiter:
			lastTagEnd = tag.end;
			break;
		case Tag::Comment:
			lastTagEnd = tag.end;
			break;
		case Tag::Null:
			break;
		}
	}

	return output;
}